

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

int helics::apps::addUsedPotentialInterfaceToCommand
              (json *potentialCommand,
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  size_type *__args;
  value_t vVar1;
  pointer pcVar2;
  json_value jVar3;
  char *pcVar4;
  size_type sVar5;
  _Hash_node_base *p_Var6;
  size_type sVar7;
  __node_base_ptr p_Var8;
  uint uVar9;
  int iVar10;
  int extraout_EAX;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *extraout_RAX;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *extraout_RAX_00;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *extraout_RAX_01;
  reference pvVar12;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *extraout_RAX_02;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *extraout_RAX_03;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *ppVar13;
  string_view fmt;
  string_view message;
  format_args args;
  vector<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  enabledInterfaces;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *local_138;
  iterator iStack_130;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *local_128;
  int local_114;
  data local_110;
  json *local_100;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  __node_base_ptr local_90;
  Federate *local_88;
  string *local_80;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
  *local_78;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  key_type local_50;
  iterator iVar11;
  
  local_138 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
               *)0x0;
  iStack_130._M_current =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
        *)0x0;
  local_128 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
               *)0x0;
  pcVar2 = (possibleFed->_M_dataplus)._M_p;
  local_114 = logLevel;
  local_100 = potentialCommand;
  local_88 = fed;
  local_80 = possibleFed;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + possibleFed->_M_string_length);
  iVar11._M_current = extraout_RAX;
  if (potentials !=
      (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
       *)0x0) {
    do {
      if ((potentials->_M_h)._M_element_count == local_68) {
        if (local_68 != 0) {
          uVar9 = bcmp(*(void **)&(potentials->_M_h)._M_rehash_policy,local_70,local_68);
          iVar11._M_current =
               (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
                *)(ulong)uVar9;
          if (uVar9 != 0) goto LAB_001f2618;
        }
        if (((ulong)potentials[1]._M_h._M_buckets & 1) != 0) {
          __args = &(potentials->_M_h)._M_bucket_count;
          if (iStack_130._M_current == local_128) {
            std::
            vector<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>
            ::
            _M_realloc_insert<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>const&>
                      ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>>
                        *)&local_138,iStack_130,
                       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
                        *)__args);
            iVar11._M_current = extraout_RAX_00;
          }
          else {
            iVar11._M_current =
                 (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
                  *)potentials[1]._M_h._M_buckets;
            *(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
              **)&((iStack_130._M_current)->second).used = iVar11._M_current;
            sVar5 = *__args;
            p_Var6 = (potentials->_M_h)._M_before_begin._M_nxt;
            sVar7 = (potentials->_M_h)._M_element_count;
            pcVar4 = *(char **)&(potentials->_M_h)._M_rehash_policy;
            p_Var8 = (potentials->_M_h)._M_single_bucket;
            ((iStack_130._M_current)->second).key._M_len =
                 (potentials->_M_h)._M_rehash_policy._M_next_resize;
            ((iStack_130._M_current)->second).key._M_str = (char *)p_Var8;
            ((iStack_130._M_current)->second).federate._M_len = sVar7;
            ((iStack_130._M_current)->second).federate._M_str = pcVar4;
            ((iStack_130._M_current)->first)._M_len = sVar5;
            ((iStack_130._M_current)->first)._M_str = (char *)p_Var6;
            iStack_130._M_current = iStack_130._M_current + 1;
          }
        }
      }
LAB_001f2618:
      potentials = (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                    *)(potentials->_M_h)._M_buckets;
    } while (potentials !=
             (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
              *)0x0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
    iVar11._M_current = extraout_RAX_01;
  }
  if (local_138 != iStack_130._M_current) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_110,(initializer_list_t)ZEXT816(0),false,array);
    pcVar2 = (type->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + type->_M_string_length);
    pvVar12 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator[](local_100,&local_50);
    vVar1 = (pvVar12->m_data).m_type;
    (pvVar12->m_data).m_type = local_110.m_type;
    jVar3 = (pvVar12->m_data).m_value;
    (pvVar12->m_data).m_value = local_110.m_value;
    local_110.m_type = vVar1;
    local_110.m_value = jVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_110);
    local_78 = iStack_130._M_current;
    iVar11._M_current = iStack_130._M_current;
    if (local_138 != iStack_130._M_current) {
      ppVar13 = local_138;
      do {
        local_d8._0_8_ = local_d8 + 0x10;
        pcVar2 = (type->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,pcVar2,pcVar2 + type->_M_string_length);
        pvVar12 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[](local_100,(key_type *)local_d8);
        pcVar4 = (ppVar13->second).key._M_str;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,pcVar4,pcVar4 + (ppVar13->second).key._M_len);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)local_f8,&local_b8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar12,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)local_f8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          (ulong)(local_b8.field_2._M_allocated_capacity + 1));
        }
        iVar11._M_current =
             (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
              *)(local_d8 + 0x10);
        if ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
             *)local_d8._0_8_ != iVar11._M_current) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          iVar11._M_current = extraout_RAX_02;
        }
        if (8 < local_114) {
          local_b8._M_dataplus._M_p = (local_80->_M_dataplus)._M_p;
          local_b8._M_string_length = local_80->_M_string_length;
          local_b8.field_2._M_allocated_capacity = (size_type)(type->_M_dataplus)._M_p;
          local_b8.field_2._8_8_ = type->_M_string_length;
          local_90 = (__node_base_ptr)(ppVar13->first)._M_len;
          local_98 = (ppVar13->first)._M_str;
          fmt.size_ = 0xddd;
          fmt.data_ = (char *)0x19;
          args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)fed;
          args.desc_ = (unsigned_long_long)&local_b8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_f8,(v11 *)"federate {} request {} {}",fmt,args);
          message._M_str = (char *)local_f8._0_8_;
          message._M_len = local_f8._8_8_;
          Federate::logMessage(local_88,9,message);
          iVar11._M_current =
               (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
                *)(local_f8 + 0x10);
          if ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
               *)local_f8._0_8_ != iVar11._M_current) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
            iVar11._M_current = extraout_RAX_03;
          }
        }
        ppVar13 = ppVar13 + 1;
      } while (ppVar13 != local_78);
    }
  }
  iVar10 = (int)iVar11._M_current;
  if (local_138 !=
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>
       *)0x0) {
    operator_delete(local_138,(long)local_128 - (long)local_138);
    iVar10 = extraout_EAX;
  }
  return iVar10;
}

Assistant:

static int addUsedPotentialInterfaceToCommand(
    nlohmann::json& potentialCommand,
    const std::unordered_map<std::string_view, PotentialConnections>& potentials,
    const std::string& possibleFed,
    int logLevel,
    const std::string& type,
    Federate* fed)
{
    int interfaceCount{0};
    std::vector<std::remove_cv_t<std::remove_reference_t<decltype(*potentials.begin())>>>
        enabledInterfaces;
    std::copy_if(potentials.begin(),
                 potentials.end(),
                 std::back_inserter(enabledInterfaces),
                 [possibleFed](auto& pInterface) {
                     return (pInterface.second.federate == possibleFed &&
                             pInterface.second.used == true);
                 });
    if (!enabledInterfaces.empty()) {
        potentialCommand[type] = nlohmann::json::array();
        for (const auto& iface : enabledInterfaces) {
            potentialCommand[type].push_back(std::string(iface.second.key));
            ++interfaceCount;
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(
                    HELICS_LOG_LEVEL_CONNECTIONS,
                    fmt::format("federate {} request {} {}", possibleFed, type, iface.first));
            }
        }
    }
    return interfaceCount;
}